

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_serialize_struct
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  string local_40;
  
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"if err := ");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = std::operator<<(poVar1,(string *)&this->write_method_name_);
  poVar1 = std::operator<<(poVar1,"(ctx, oprot); err != nil {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T error writing struct: \", "
                          );
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,"), err)");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void t_go_generator::generate_serialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  (void)tstruct;
  out << indent() << "if err := " << prefix << "." << write_method_name_ << "(ctx, oprot); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T error writing struct: \", "
      << prefix << "), err)" << endl;
  out << indent() << "}" << endl;
}